

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCooperativeMatrixLoadStoreKHR
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint uVar4;
  AddressingModel AVar5;
  int32_t iVar6;
  uint32_t uVar7;
  spv_result_t sVar8;
  Instruction *this;
  DiagnosticStream *pDVar9;
  Feature *pFVar10;
  spv_const_context psVar11;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar12;
  size_type sVar13;
  bool local_12b9;
  spv_result_t error;
  uint memory_access_index;
  string local_1088;
  DiagnosticStream local_1068;
  Instruction *local_e90;
  Instruction *stride;
  uint stride_id;
  uint stride_index;
  uint64_t layout;
  undefined1 local_e70 [7];
  bool stride_required;
  DiagnosticStream local_e50;
  Instruction *local_c78;
  Instruction *layout_inst;
  uint layout_id;
  uint layout_index;
  DiagnosticStream local_c48;
  Instruction *local_a70;
  Instruction *pointee_type;
  undefined1 local_a60 [4];
  uint pointee_id;
  string local_a40;
  DiagnosticStream local_a20;
  StorageClass local_844;
  undefined4 local_840;
  StorageClass storage_class;
  uint storage_class_index;
  bool untyped;
  DiagnosticStream local_818;
  Instruction *local_640;
  Instruction *pointer_type;
  undefined1 local_630 [4];
  uint32_t pointer_type_id;
  DiagnosticStream local_610;
  Instruction *local_438;
  Instruction *pointer;
  uint pointer_id;
  uint pointer_index;
  DiagnosticStream local_408;
  string local_230;
  DiagnosticStream local_210;
  Instruction *local_38;
  Instruction *matrix_type;
  char *opname;
  Instruction *pIStack_20;
  uint32_t type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = (Instruction *)inst;
  inst_local = (Instruction *)_;
  OVar3 = val::Instruction::opcode((Instruction *)inst);
  pIVar1 = inst_local;
  if (OVar3 == OpCooperativeMatrixLoadKHR) {
    opname._4_4_ = val::Instruction::type_id(pIStack_20);
    matrix_type = (Instruction *)anon_var_dwarf_2409155;
  }
  else {
    uVar4 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,1);
    this = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
    opname._4_4_ = val::Instruction::type_id(this);
    matrix_type = (Instruction *)anon_var_dwarf_2409161;
  }
  local_38 = ValidationState_t::FindDef((ValidationState_t *)inst_local,opname._4_4_);
  OVar3 = val::Instruction::opcode(local_38);
  if (OVar3 != OpTypeCooperativeMatrixKHR) {
    OVar3 = val::Instruction::opcode(pIStack_20);
    if (OVar3 == OpCooperativeMatrixLoadKHR) {
      ValidationState_t::diag
                (&local_210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar9 = DiagnosticStream::operator<<
                         (&local_210,
                          (char (*) [54])"spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                (&local_230,(ValidationState_t *)inst_local,opname._4_4_);
      pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_230);
      pDVar9 = DiagnosticStream::operator<<
                         (pDVar9,(char (*) [35])" is not a cooperative matrix type.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      std::__cxx11::string::~string((string *)&local_230);
      DiagnosticStream::~DiagnosticStream(&local_210);
      return __local._4_4_;
    }
    ValidationState_t::diag
              (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar9 = DiagnosticStream::operator<<
                       (&local_408,
                        (char (*) [55])"spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&pointer_id,(ValidationState_t *)inst_local,opname._4_4_);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pointer_id);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(char (*) [35])" is not a cooperative matrix type.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    std::__cxx11::string::~string((string *)&pointer_id);
    DiagnosticStream::~DiagnosticStream(&local_408);
    return __local._4_4_;
  }
  OVar3 = val::Instruction::opcode(pIStack_20);
  pointer._4_4_ = 0;
  if (OVar3 == OpCooperativeMatrixLoadKHR) {
    pointer._4_4_ = 2;
  }
  pointer._0_4_ = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,(ulong)pointer._4_4_);
  local_438 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)pointer);
  if (local_438 == (Instruction *)0x0) {
LAB_00b521d0:
    ValidationState_t::diag
              (&local_610,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar9 = DiagnosticStream::operator<<(&local_610,(char **)&matrix_type);
    pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [15])0xf3dffd);
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)local_630,(ValidationState_t *)inst_local,(uint)pointer);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_630);
    pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [27])" is not a logical pointer.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    std::__cxx11::string::~string((string *)local_630);
    DiagnosticStream::~DiagnosticStream(&local_610);
    return __local._4_4_;
  }
  AVar5 = ValidationState_t::addressing_model((ValidationState_t *)inst_local);
  if (AVar5 == AddressingModelLogical) {
    pFVar10 = ValidationState_t::features((ValidationState_t *)inst_local);
    if ((pFVar10->variable_pointers & 1U) == 0) {
      OVar3 = val::Instruction::opcode(local_438);
      iVar6 = spvOpcodeReturnsLogicalPointer(OVar3);
      if (iVar6 == 0) goto LAB_00b521d0;
    }
    pFVar10 = ValidationState_t::features((ValidationState_t *)inst_local);
    if ((pFVar10->variable_pointers & 1U) != 0) {
      OVar3 = val::Instruction::opcode(local_438);
      bVar2 = spvOpcodeReturnsLogicalVariablePointer(OVar3);
      if (!bVar2) goto LAB_00b521d0;
    }
  }
  pointer_type._4_4_ = val::Instruction::type_id(local_438);
  local_640 = ValidationState_t::FindDef((ValidationState_t *)inst_local,pointer_type._4_4_);
  if ((local_640 == (Instruction *)0x0) ||
     ((OVar3 = val::Instruction::opcode(local_640), OVar3 != OpTypePointer &&
      (OVar3 = val::Instruction::opcode(local_640), OVar3 != OpTypeUntypedPointerKHR)))) {
    ValidationState_t::diag
              (&local_818,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar9 = DiagnosticStream::operator<<(&local_818,(char **)&matrix_type);
    pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [24])0xf3e02d);
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&storage_class_index,(ValidationState_t *)inst_local,(uint)pointer);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &storage_class_index);
    pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [24])0xf44afc);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    std::__cxx11::string::~string((string *)&storage_class_index);
    DiagnosticStream::~DiagnosticStream(&local_818);
    return __local._4_4_;
  }
  OVar3 = val::Instruction::opcode(local_640);
  storage_class._3_1_ = OVar3 == OpTypeUntypedPointerKHR;
  local_840 = 1;
  local_844 = val::Instruction::GetOperandAs<spv::StorageClass>(local_640,1);
  psVar11 = ValidationState_t::context((ValidationState_t *)inst_local);
  bVar2 = spvIsVulkanEnv(psVar11->target_env);
  if ((((bVar2) && (local_844 != StorageClassWorkgroup)) && (local_844 != StorageBuffer)) &&
     (local_844 != PhysicalStorageBuffer)) {
    ValidationState_t::diag
              (&local_a20,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    ValidationState_t::VkErrorID_abi_cxx11_
              (&local_a40,(ValidationState_t *)inst_local,0x230d,(char *)0x0);
    pDVar9 = DiagnosticStream::operator<<(&local_a20,&local_a40);
    pDVar9 = DiagnosticStream::operator<<(pDVar9,(char **)&matrix_type);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(char (*) [38])" storage class for pointer type <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)local_a60,(ValidationState_t *)inst_local,pointer_type._4_4_);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a60);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(char (*) [60])
                               " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    std::__cxx11::string::~string((string *)local_a60);
    std::__cxx11::string::~string((string *)&local_a40);
    DiagnosticStream::~DiagnosticStream(&local_a20);
    return __local._4_4_;
  }
  if ((storage_class._3_1_ & 1) == StorageClassUniformConstant >> 0x18) {
    pointee_type._4_4_ = val::Instruction::GetOperandAs<unsigned_int>(local_640,2);
    local_a70 = ValidationState_t::FindDef((ValidationState_t *)inst_local,pointee_type._4_4_);
    if ((local_a70 == (Instruction *)0x0) ||
       ((bVar2 = ValidationState_t::IsIntScalarOrVectorType
                           ((ValidationState_t *)inst_local,pointee_type._4_4_), !bVar2 &&
        (bVar2 = ValidationState_t::IsFloatScalarOrVectorType
                           ((ValidationState_t *)inst_local,pointee_type._4_4_), !bVar2)))) {
      ValidationState_t::diag
                (&local_c48,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar9 = DiagnosticStream::operator<<(&local_c48,(char **)&matrix_type);
      pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [15])0xf3dffd);
      pIVar1 = inst_local;
      uVar7 = val::Instruction::id(local_438);
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&layout_id,(ValidationState_t *)pIVar1,uVar7);
      pDVar9 = DiagnosticStream::operator<<
                         (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&layout_id);
      pDVar9 = DiagnosticStream::operator<<
                         (pDVar9,(char (*) [40])"s Type must be a scalar or vector type.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      std::__cxx11::string::~string((string *)&layout_id);
      DiagnosticStream::~DiagnosticStream(&local_c48);
      return __local._4_4_;
    }
  }
  OVar3 = val::Instruction::opcode(pIStack_20);
  layout_inst._4_4_ = 2;
  if (OVar3 == OpCooperativeMatrixLoadKHR) {
    layout_inst._4_4_ = 3;
  }
  layout_inst._0_4_ =
       val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,(ulong)layout_inst._4_4_);
  local_c78 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)layout_inst);
  pIVar1 = inst_local;
  if (local_c78 != (Instruction *)0x0) {
    uVar7 = val::Instruction::type_id(local_c78);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar1,uVar7);
    if (bVar2) {
      OVar3 = val::Instruction::opcode(local_c78);
      iVar6 = spvOpcodeIsConstant(OVar3);
      if (iVar6 != 0) {
        layout._7_1_ = 0;
        bVar2 = ValidationState_t::EvalConstantValUint64
                          ((ValidationState_t *)inst_local,(uint)layout_inst,(uint64_t *)&stride_id)
        ;
        if (bVar2) {
          local_12b9 = _stride_id < 2;
          layout._7_1_ = local_12b9;
        }
        OVar3 = val::Instruction::opcode(pIStack_20);
        stride._4_4_ = 3;
        if (OVar3 == OpCooperativeMatrixLoadKHR) {
          stride._4_4_ = 4;
        }
        pvVar12 = val::Instruction::operands(pIStack_20);
        sVar13 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                           (pvVar12);
        if (stride._4_4_ < sVar13) {
          stride._0_4_ = val::Instruction::GetOperandAs<unsigned_int>
                                   (pIStack_20,(ulong)stride._4_4_);
          local_e90 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)stride);
          pIVar1 = inst_local;
          if (local_e90 != (Instruction *)0x0) {
            uVar7 = val::Instruction::type_id(local_e90);
            bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar1,uVar7);
            if (bVar2) goto LAB_00b5291e;
          }
          ValidationState_t::diag
                    (&local_1068,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
          pDVar9 = DiagnosticStream::operator<<(&local_1068,(char (*) [21])"Stride operand <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_1088,(ValidationState_t *)inst_local,(uint)stride);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_1088);
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [32])" must be a scalar integer type.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          std::__cxx11::string::~string((string *)&local_1088);
          DiagnosticStream::~DiagnosticStream(&local_1068);
          return __local._4_4_;
        }
        if ((layout._7_1_ & 1) != 0) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&error,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID
                     ,pIStack_20);
          pDVar9 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&error,(char (*) [14])"MemoryLayout ");
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(unsigned_long *)&stride_id);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [20])" requires a Stride.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error);
          return __local._4_4_;
        }
LAB_00b5291e:
        OVar3 = val::Instruction::opcode(pIStack_20);
        uVar4 = 4;
        if (OVar3 == OpCooperativeMatrixLoadKHR) {
          uVar4 = 5;
        }
        pvVar12 = val::Instruction::operands(pIStack_20);
        sVar13 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                           (pvVar12);
        if ((uVar4 < sVar13) &&
           (sVar8 = CheckMemoryAccess((ValidationState_t *)inst_local,(Instruction *)pIStack_20,
                                      uVar4), sVar8 != SPV_SUCCESS)) {
          return sVar8;
        }
        return SPV_SUCCESS;
      }
    }
  }
  ValidationState_t::diag
            (&local_e50,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar9 = DiagnosticStream::operator<<(&local_e50,(char (*) [27])"MemoryLayout operand <id> ");
  ValidationState_t::getIdName_abi_cxx11_
            ((string *)local_e70,(ValidationState_t *)inst_local,(uint)layout_inst);
  pDVar9 = DiagnosticStream::operator<<
                     (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e70);
  pDVar9 = DiagnosticStream::operator<<
                     (pDVar9,(char (*) [48])" must be a 32-bit integer constant instruction.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
  std::__cxx11::string::~string((string *)local_e70);
  DiagnosticStream::~DiagnosticStream(&local_e50);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateCooperativeMatrixLoadStoreKHR(ValidationState_t& _,
                                                   const Instruction* inst) {
  uint32_t type_id;
  const char* opname;
  if (inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) {
    type_id = inst->type_id();
    opname = "spv::Op::OpCooperativeMatrixLoadKHR";
  } else {
    // get Object operand's type
    type_id = _.FindDef(inst->GetOperandAs<uint32_t>(1))->type_id();
    opname = "spv::Op::OpCooperativeMatrixStoreKHR";
  }

  auto matrix_type = _.FindDef(type_id);

  if (matrix_type->opcode() != spv::Op::OpTypeCooperativeMatrixKHR) {
    if (inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> "
             << _.getIdName(type_id) << " is not a cooperative matrix type.";
    } else {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> "
             << _.getIdName(type_id) << " is not a cooperative matrix type.";
    }
  }

  const auto pointer_index =
      (inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) ? 2u : 0u;
  const auto pointer_id = inst->GetOperandAs<uint32_t>(pointer_index);
  const auto pointer = _.FindDef(pointer_id);
  if (!pointer ||
      ((_.addressing_model() == spv::AddressingModel::Logical) &&
       ((!_.features().variable_pointers &&
         !spvOpcodeReturnsLogicalPointer(pointer->opcode())) ||
        (_.features().variable_pointers &&
         !spvOpcodeReturnsLogicalVariablePointer(pointer->opcode()))))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << opname << " Pointer <id> " << _.getIdName(pointer_id)
           << " is not a logical pointer.";
  }

  const auto pointer_type_id = pointer->type_id();
  const auto pointer_type = _.FindDef(pointer_type_id);
  if (!pointer_type ||
      !(pointer_type->opcode() == spv::Op::OpTypePointer ||
        pointer_type->opcode() == spv::Op::OpTypeUntypedPointerKHR)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << opname << " type for pointer <id> " << _.getIdName(pointer_id)
           << " is not a pointer type.";
  }

  const bool untyped =
      pointer_type->opcode() == spv::Op::OpTypeUntypedPointerKHR;
  const auto storage_class_index = 1u;
  const auto storage_class =
      pointer_type->GetOperandAs<spv::StorageClass>(storage_class_index);

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (storage_class != spv::StorageClass::Workgroup &&
        storage_class != spv::StorageClass::StorageBuffer &&
        storage_class != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(8973) << opname
             << " storage class for pointer type <id> "
             << _.getIdName(pointer_type_id)
             << " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.";
    }
  }

  if (!untyped) {
    const auto pointee_id = pointer_type->GetOperandAs<uint32_t>(2);
    const auto pointee_type = _.FindDef(pointee_id);
    if (!pointee_type || !(_.IsIntScalarOrVectorType(pointee_id) ||
                           _.IsFloatScalarOrVectorType(pointee_id))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << opname << " Pointer <id> " << _.getIdName(pointer->id())
             << "s Type must be a scalar or vector type.";
    }
  }

  const auto layout_index =
      (inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) ? 3u : 2u;
  const auto layout_id = inst->GetOperandAs<uint32_t>(layout_index);
  const auto layout_inst = _.FindDef(layout_id);
  if (!layout_inst || !_.IsIntScalarType(layout_inst->type_id()) ||
      !spvOpcodeIsConstant(layout_inst->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "MemoryLayout operand <id> " << _.getIdName(layout_id)
           << " must be a 32-bit integer constant instruction.";
  }

  bool stride_required = false;
  uint64_t layout;
  if (_.EvalConstantValUint64(layout_id, &layout)) {
    stride_required =
        (layout == (uint64_t)spv::CooperativeMatrixLayout::RowMajorKHR) ||
        (layout == (uint64_t)spv::CooperativeMatrixLayout::ColumnMajorKHR);
  }

  const auto stride_index =
      (inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) ? 4u : 3u;
  if (inst->operands().size() > stride_index) {
    const auto stride_id = inst->GetOperandAs<uint32_t>(stride_index);
    const auto stride = _.FindDef(stride_id);
    if (!stride || !_.IsIntScalarType(stride->type_id())) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Stride operand <id> " << _.getIdName(stride_id)
             << " must be a scalar integer type.";
    }
  } else if (stride_required) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "MemoryLayout " << layout << " requires a Stride.";
  }

  const auto memory_access_index =
      (inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) ? 5u : 4u;
  if (inst->operands().size() > memory_access_index) {
    if (auto error = CheckMemoryAccess(_, inst, memory_access_index))
      return error;
  }

  return SPV_SUCCESS;
}